

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrEnumerateSwapchainImages
                   (XrSwapchain swapchain,uint32_t imageCapacityInput,uint32_t *imageCountOutput,
                   XrSwapchainImageBaseHeader *images)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_3c;
  LoaderInstance *pLStack_38;
  XrResult result;
  LoaderInstance *loader_instance;
  XrSwapchainImageBaseHeader *images_local;
  uint32_t *imageCountOutput_local;
  XrSwapchain pXStack_18;
  uint32_t imageCapacityInput_local;
  XrSwapchain swapchain_local;
  
  loader_instance = (LoaderInstance *)images;
  images_local = (XrSwapchainImageBaseHeader *)imageCountOutput;
  imageCountOutput_local._4_4_ = imageCapacityInput;
  pXStack_18 = swapchain;
  local_3c = ActiveLoaderInstance::Get(&stack0xffffffffffffffc8,"xrEnumerateSwapchainImages");
  if (XR_ERROR_VALIDATION_FAILURE < local_3c) {
    this = LoaderInstance::DispatchTable(pLStack_38);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_3c = (*pXVar1->EnumerateSwapchainImages)
                         (pXStack_18,imageCountOutput_local._4_4_,&images_local->type,
                          (XrSwapchainImageBaseHeader *)loader_instance);
  }
  return local_3c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrEnumerateSwapchainImages(
    XrSwapchain                                 swapchain,
    uint32_t                                    imageCapacityInput,
    uint32_t*                                   imageCountOutput,
    XrSwapchainImageBaseHeader*                 images) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrEnumerateSwapchainImages");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->EnumerateSwapchainImages(swapchain, imageCapacityInput, imageCountOutput, images);
    }
    return result;
}